

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

BinaryExpr<const_protozero::const_varint_iterator<unsigned_int>_&,_const_protozero::const_varint_iterator<unsigned_int>_&>
* __thiscall
Catch::ExprLhs<protozero::const_varint_iterator<unsigned_int>const&>::operator==
          (BinaryExpr<const_protozero::const_varint_iterator<unsigned_int>_&,_const_protozero::const_varint_iterator<unsigned_int>_&>
           *__return_storage_ptr__,
          ExprLhs<protozero::const_varint_iterator<unsigned_int>const&> *this,
          const_varint_iterator<unsigned_int> *rhs)

{
  const_varint_iterator<unsigned_int> *pcVar1;
  undefined4 unaff_EBP;
  int iVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  StringRef local_38;
  
  pcVar1 = *(const_varint_iterator<unsigned_int> **)this;
  auVar4._0_4_ = -(uint)(*(int *)&rhs->m_data == *(int *)&pcVar1->m_data);
  auVar4._4_4_ = -(uint)(*(int *)((long)&rhs->m_data + 4) == *(int *)((long)&pcVar1->m_data + 4));
  auVar4._8_4_ = -(uint)(*(int *)&rhs->m_end == *(int *)&pcVar1->m_end);
  auVar4._12_4_ = -(uint)(*(int *)((long)&rhs->m_end + 4) == *(int *)((long)&pcVar1->m_end + 4));
  auVar3._4_4_ = auVar4._0_4_;
  auVar3._0_4_ = auVar4._4_4_;
  auVar3._8_4_ = auVar4._12_4_;
  auVar3._12_4_ = auVar4._8_4_;
  iVar2 = movmskpd(unaff_EBP,auVar3 & auVar4);
  StringRef::StringRef(&local_38,"==");
  (__return_storage_ptr__->super_ITransientExpression).m_isBinaryExpression = true;
  (__return_storage_ptr__->super_ITransientExpression).m_result = iVar2 == 3;
  (__return_storage_ptr__->super_ITransientExpression)._vptr_ITransientExpression =
       (_func_int **)&PTR_streamReconstructedExpression_0019ca98;
  __return_storage_ptr__->m_lhs = pcVar1;
  (__return_storage_ptr__->m_op).m_start = local_38.m_start;
  (__return_storage_ptr__->m_op).m_size = local_38.m_size;
  __return_storage_ptr__->m_rhs = rhs;
  return __return_storage_ptr__;
}

Assistant:

auto operator == ( RhsT const& rhs ) -> BinaryExpr<LhsT, RhsT const&> const {
            return { compareEqual( m_lhs, rhs ), m_lhs, "==", rhs };
        }